

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::Logger::~Logger(Logger *this)

{
  TestLog *this_00;
  byte bVar1;
  char *msgStr;
  string local_50 [32];
  string local_30 [32];
  Logger *local_10;
  Logger *this_local;
  
  this_00 = glcts::(anonymous_namespace)::Logger::s_tcuLog;
  local_10 = this;
  std::__cxx11::ostringstream::str();
  msgStr = (char *)std::__cxx11::string::c_str();
  tcu::TestLog::writeMessage(this_00,msgStr);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::ostringstream::str();
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_50);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    tcu::TestLog::writeMessage(glcts::(anonymous_namespace)::Logger::s_tcuLog,"\n");
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->str_);
  return;
}

Assistant:

~Logger()
	{
		s_tcuLog->writeMessage(str_.str().c_str());
		if (!str_.str().empty())
		{
			s_tcuLog->writeMessage(NL);
		}
	}